

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterNext_None(Fts5Index *p,Fts5SegIter *pIter,int *pbNewTerm)

{
  u8 *puVar1;
  Fts5Hash *pHash;
  Fts5Data *pFVar2;
  u8 *p_00;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  int nKeep;
  int nList;
  i64 iDelta;
  u8 *local_50;
  int local_44;
  u8 *local_40;
  int *local_38;
  
  iVar6 = pIter->iLeafOffset;
  if ((pIter->pSeg != (Fts5StructureSegment *)0x0) && (pIter->pLeaf->szLeaf <= iVar6)) {
    fts5SegIterNextPage(p,pIter);
    if (p->rc != 0) {
      return;
    }
    if (pIter->pLeaf == (Fts5Data *)0x0) {
      return;
    }
    pIter->iRowid = 0;
    iVar6 = 4;
  }
  if (iVar6 < pIter->iEndofDoclist) {
    bVar3 = sqlite3Fts5GetVarint(pIter->pLeaf->p + iVar6,(u64 *)&local_40);
    pIter->iLeafOffset = (uint)bVar3 + iVar6;
    pIter->iRowid = (i64)(local_40 + pIter->iRowid);
  }
  else {
    if ((pIter->flags & 1) != 0) {
LAB_001cc328:
      sqlite3_free(pIter->pLeaf);
      pIter->pLeaf = (Fts5Data *)0x0;
      return;
    }
    if (pIter->pSeg == (Fts5StructureSegment *)0x0) {
      local_40 = (uchar *)0x0;
      local_50 = (u8 *)0x0;
      pHash = p->pHash;
      pHash->pScan = pHash->pScan->pScanNext;
      sqlite3Fts5HashScanEntry(pHash,(char **)&local_50,&local_40,&local_44);
      p_00 = local_40;
      puVar1 = local_50;
      if (local_40 == (uchar *)0x0) goto LAB_001cc328;
      pFVar2 = pIter->pLeaf;
      pFVar2->p = local_40;
      pFVar2->nn = local_44;
      pFVar2->szLeaf = local_44;
      pIter->iEndofDoclist = local_44;
      local_38 = &p->rc;
      sVar5 = strlen((char *)local_50);
      (pIter->term).n = 0;
      sqlite3Fts5BufferAppendBlob(local_38,&pIter->term,(u32)sVar5,puVar1);
      bVar3 = sqlite3Fts5GetVarint(p_00,(u64 *)&pIter->iRowid);
      pIter->iLeafOffset = (uint)bVar3;
    }
    else {
      local_50 = (u8 *)((ulong)local_50 & 0xffffffff00000000);
      puVar1 = pIter->pLeaf->p;
      sqlite3Fts5GetVarint32(puVar1 + pIter->pLeaf->szLeaf,(u32 *)&local_40);
      if (iVar6 != (int)local_40) {
        iVar4 = sqlite3Fts5GetVarint32(puVar1 + iVar6,(u32 *)&local_50);
        iVar6 = iVar6 + iVar4;
      }
      pIter->iLeafOffset = iVar6;
      fts5SegIterLoadTerm(p,pIter,(int)local_50);
    }
    if (pbNewTerm != (int *)0x0) {
      *pbNewTerm = 1;
    }
  }
  fts5SegIterLoadNPos(p,pIter);
  return;
}

Assistant:

static void fts5SegIterNext_None(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter,             /* Iterator to advance */
  int *pbNewTerm                  /* OUT: Set for new term */
){
  int iOff;

  assert( p->rc==SQLITE_OK );
  assert( (pIter->flags & FTS5_SEGITER_REVERSE)==0 );
  assert( p->pConfig->eDetail==FTS5_DETAIL_NONE );

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  iOff = pIter->iLeafOffset;

  /* Next entry is on the next page */
  if( pIter->pSeg && iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( p->rc || pIter->pLeaf==0 ) return;
    pIter->iRowid = 0;
    iOff = 4;
  }

  if( iOff<pIter->iEndofDoclist ){
    /* Next entry is on the current page */
    i64 iDelta;
    iOff += sqlite3Fts5GetVarint(&pIter->pLeaf->p[iOff], (u64*)&iDelta);
    pIter->iLeafOffset = iOff;
    pIter->iRowid += iDelta;
  }else if( (pIter->flags & FTS5_SEGITER_ONETERM)==0 ){
    if( pIter->pSeg ){
      int nKeep = 0;
      if( iOff!=fts5LeafFirstTermOff(pIter->pLeaf) ){
        iOff += fts5GetVarint32(&pIter->pLeaf->p[iOff], nKeep);
      }
      pIter->iLeafOffset = iOff;
      fts5SegIterLoadTerm(p, pIter, nKeep);
    }else{
      const u8 *pList = 0;
      const char *zTerm = 0;
      int nList;
      sqlite3Fts5HashScanNext(p->pHash);
      sqlite3Fts5HashScanEntry(p->pHash, &zTerm, &pList, &nList);
      if( pList==0 ) goto next_none_eof;
      pIter->pLeaf->p = (u8*)pList;
      pIter->pLeaf->nn = nList;
      pIter->pLeaf->szLeaf = nList;
      pIter->iEndofDoclist = nList;
      sqlite3Fts5BufferSet(&p->rc,&pIter->term, (int)strlen(zTerm), (u8*)zTerm);
      pIter->iLeafOffset = fts5GetVarint(pList, (u64*)&pIter->iRowid);
    }

    if( pbNewTerm ) *pbNewTerm = 1;
  }else{
    goto next_none_eof;
  }

  fts5SegIterLoadNPos(p, pIter);

  return;
 next_none_eof:
  fts5DataRelease(pIter->pLeaf);
  pIter->pLeaf = 0;
}